

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSliderConstraint.cpp
# Opt level: O3

btScalar __thiscall btSliderConstraint::getParam(btSliderConstraint *this,int num,int axis)

{
  btScalar bVar1;
  
  bVar1 = 3.4028235e+38;
  if (num == 4) {
    if (axis < 1) {
      return this->m_cfmLimLin;
    }
    if ((uint)axis < 3) {
      return this->m_cfmOrthoLin;
    }
    if (axis == 3) {
      return this->m_cfmLimAng;
    }
    if ((uint)axis < 6) {
      return this->m_cfmOrthoAng;
    }
  }
  else if (num == 3) {
    if (axis < 1) {
      return this->m_cfmDirLin;
    }
    if (axis == 3) {
      return this->m_cfmDirAng;
    }
  }
  else if (num == 2) {
    if (axis < 1) {
      return this->m_softnessLimLin;
    }
    if ((uint)axis < 3) {
      return this->m_softnessOrthoLin;
    }
    if (axis == 3) {
      return this->m_softnessLimAng;
    }
    if ((uint)axis < 6) {
      bVar1 = this->m_softnessOrthoAng;
    }
  }
  return bVar1;
}

Assistant:

btScalar btSliderConstraint::getParam(int num, int axis) const 
{
	btScalar retVal(SIMD_INFINITY);
	switch(num)
	{
	case BT_CONSTRAINT_STOP_ERP :
		if(axis < 1)
		{
			btAssertConstrParams(m_flags & BT_SLIDER_FLAGS_ERP_LIMLIN);
			retVal = m_softnessLimLin;
		}
		else if(axis < 3)
		{
			btAssertConstrParams(m_flags & BT_SLIDER_FLAGS_ERP_ORTLIN);
			retVal = m_softnessOrthoLin;
		}
		else if(axis == 3)
		{
			btAssertConstrParams(m_flags & BT_SLIDER_FLAGS_ERP_LIMANG);
			retVal = m_softnessLimAng;
		}
		else if(axis < 6)
		{
			btAssertConstrParams(m_flags & BT_SLIDER_FLAGS_ERP_ORTANG);
			retVal = m_softnessOrthoAng;
		}
		else
		{
			btAssertConstrParams(0);
		}
		break;
	case BT_CONSTRAINT_CFM :
		if(axis < 1)
		{
			btAssertConstrParams(m_flags & BT_SLIDER_FLAGS_CFM_DIRLIN);
			retVal = m_cfmDirLin;
		}
		else if(axis == 3)
		{
			btAssertConstrParams(m_flags & BT_SLIDER_FLAGS_CFM_DIRANG);
			retVal = m_cfmDirAng;
		}
		else
		{
			btAssertConstrParams(0);
		}
		break;
	case BT_CONSTRAINT_STOP_CFM :
		if(axis < 1)
		{
			btAssertConstrParams(m_flags & BT_SLIDER_FLAGS_CFM_LIMLIN);
			retVal = m_cfmLimLin;
		}
		else if(axis < 3)
		{
			btAssertConstrParams(m_flags & BT_SLIDER_FLAGS_CFM_ORTLIN);
			retVal = m_cfmOrthoLin;
		}
		else if(axis == 3)
		{
			btAssertConstrParams(m_flags & BT_SLIDER_FLAGS_CFM_LIMANG);
			retVal = m_cfmLimAng;
		}
		else if(axis < 6)
		{
			btAssertConstrParams(m_flags & BT_SLIDER_FLAGS_CFM_ORTANG);
			retVal = m_cfmOrthoAng;
		}
		else
		{
			btAssertConstrParams(0);
		}
		break;
	}
	return retVal;
}